

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestRunner.cpp
# Opt level: O0

configInfo * glcts::parseConfigBitsFromName(configInfo *__return_storage_ptr__,char *configName)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  int local_20;
  int local_1c;
  int ndx_3;
  int ndx_2;
  int ndx_1;
  int ndx;
  char *configName_local;
  
  for (ndx_2 = 0; _ndx_1 = configName, ndx_2 < 2; ndx_2 = ndx_2 + 1) {
    pcVar1 = parseConfigBitsFromName::colorCfgs[ndx_2].name;
    sVar3 = strlen(parseConfigBitsFromName::colorCfgs[ndx_2].name);
    iVar2 = strncmp(configName,pcVar1,sVar3);
    if (iVar2 == 0) {
      __return_storage_ptr__->redBits = parseConfigBitsFromName::colorCfgs[ndx_2].redBits;
      __return_storage_ptr__->greenBits = parseConfigBitsFromName::colorCfgs[ndx_2].greenBits;
      __return_storage_ptr__->blueBits = parseConfigBitsFromName::colorCfgs[ndx_2].blueBits;
      __return_storage_ptr__->alphaBits = parseConfigBitsFromName::colorCfgs[ndx_2].alphaBits;
      sVar3 = strlen(parseConfigBitsFromName::colorCfgs[ndx_2].name);
      _ndx_1 = configName + sVar3;
      break;
    }
  }
  for (ndx_3 = 0; ndx_3 < 2; ndx_3 = ndx_3 + 1) {
    pcVar1 = parseConfigBitsFromName::depthCfgs[ndx_3].name;
    sVar3 = strlen(parseConfigBitsFromName::depthCfgs[ndx_3].name);
    iVar2 = strncmp(_ndx_1,pcVar1,sVar3);
    if (iVar2 == 0) {
      __return_storage_ptr__->depthBits = parseConfigBitsFromName::depthCfgs[ndx_3].depthBits;
      sVar3 = strlen(parseConfigBitsFromName::depthCfgs[ndx_3].name);
      _ndx_1 = _ndx_1 + sVar3;
      break;
    }
  }
  local_1c = 0;
  do {
    if (1 < local_1c) {
LAB_00decc22:
      local_20 = 0;
      while( true ) {
        if (1 < local_20) {
          return __return_storage_ptr__;
        }
        pcVar1 = parseConfigBitsFromName::multiSampleCfgs[local_20].name;
        sVar3 = strlen(parseConfigBitsFromName::multiSampleCfgs[local_20].name);
        iVar2 = strncmp(_ndx_1,pcVar1,sVar3);
        if (iVar2 == 0) break;
        local_20 = local_20 + 1;
      }
      __return_storage_ptr__->samples = parseConfigBitsFromName::multiSampleCfgs[local_20].samples;
      strlen(parseConfigBitsFromName::multiSampleCfgs[local_20].name);
      return __return_storage_ptr__;
    }
    pcVar1 = parseConfigBitsFromName::stencilCfgs[local_1c].name;
    sVar3 = strlen(parseConfigBitsFromName::stencilCfgs[local_1c].name);
    iVar2 = strncmp(_ndx_1,pcVar1,sVar3);
    if (iVar2 == 0) {
      __return_storage_ptr__->stencilBits =
           parseConfigBitsFromName::stencilCfgs[local_1c].stencilBits;
      sVar3 = strlen(parseConfigBitsFromName::stencilCfgs[local_1c].name);
      _ndx_1 = _ndx_1 + sVar3;
      goto LAB_00decc22;
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

static configInfo parseConfigBitsFromName(const char* configName)
{
	configInfo cfgInfo;
	static const struct
	{
		const char* name;
		int			redBits;
		int			greenBits;
		int			blueBits;
		int			alphaBits;
	} colorCfgs[] = {
		{ "rgba8888", 8, 8, 8, 8 }, { "rgb565", 5, 6, 5, 0 },
	};
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(colorCfgs); ndx++)
	{
		if (!strncmp(configName, colorCfgs[ndx].name, strlen(colorCfgs[ndx].name)))
		{
			cfgInfo.redBits   = colorCfgs[ndx].redBits;
			cfgInfo.greenBits = colorCfgs[ndx].greenBits;
			cfgInfo.blueBits  = colorCfgs[ndx].blueBits;
			cfgInfo.alphaBits = colorCfgs[ndx].alphaBits;

			configName += strlen(colorCfgs[ndx].name);
			break;
		}
	}

	static const struct
	{
		const char* name;
		int			depthBits;
	} depthCfgs[] = {
		{ "d0", 0 }, { "d24", 24 },
	};
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(depthCfgs); ndx++)
	{
		if (!strncmp(configName, depthCfgs[ndx].name, strlen(depthCfgs[ndx].name)))
		{
			cfgInfo.depthBits = depthCfgs[ndx].depthBits;

			configName += strlen(depthCfgs[ndx].name);
			break;
		}
	}

	static const struct
	{
		const char* name;
		int			stencilBits;
	} stencilCfgs[] = {
		{ "s0", 0 }, { "s8", 8 },
	};
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(stencilCfgs); ndx++)
	{
		if (!strncmp(configName, stencilCfgs[ndx].name, strlen(stencilCfgs[ndx].name)))
		{
			cfgInfo.stencilBits = stencilCfgs[ndx].stencilBits;

			configName += strlen(stencilCfgs[ndx].name);
			break;
		}
	}

	static const struct
	{
		const char* name;
		int			samples;
	} multiSampleCfgs[] = {
		{ "ms0", 0 }, { "ms4", 4 },
	};
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(multiSampleCfgs); ndx++)
	{
		if (!strncmp(configName, multiSampleCfgs[ndx].name, strlen(multiSampleCfgs[ndx].name)))
		{
			cfgInfo.samples = multiSampleCfgs[ndx].samples;

			configName += strlen(multiSampleCfgs[ndx].name);
			break;
		}
	}

	return cfgInfo;
}